

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitHop.c
# Opt level: O3

int Kit_GraphToGiaInternal(Gia_Man_t *pMan,Kit_Graph_t *pGraph,int fHash)

{
  Kit_Node_t *pKVar1;
  Gia_Obj_t *pGVar2;
  uint uVar3;
  long lVar4;
  Gia_Obj_t *pGVar5;
  uint *puVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  uint iLit1;
  ulong uVar15;
  uint iLit0;
  uint uVar16;
  
  if (pGraph->fConst == 0) {
    uVar13 = (ulong)(uint)pGraph->nLeaves;
    uVar7 = (uint)pGraph->eRoot >> 1 & 0x3fffffff;
    if (uVar7 < (uint)pGraph->nLeaves) {
      uVar7 = pGraph->pNodes[uVar7].field_2.iFunc;
      if ((int)uVar7 < 0) {
LAB_0055fc11:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                      ,0xf5,"int Abc_LitNotCond(int, int)");
      }
      uVar3 = (uint)pGraph->eRoot & 1;
    }
    else {
      lVar14 = uVar13 * 0x18 + 8;
      do {
        pKVar1 = pGraph->pNodes;
        uVar7 = *(uint *)((long)pKVar1 + lVar14 + -8);
        uVar16 = pKVar1[uVar7 >> 1 & 0x3fffffff].field_2.iFunc;
        if ((int)uVar16 < 0) goto LAB_0055fc11;
        uVar8 = *(uint *)((long)pKVar1 + lVar14 + -4);
        uVar10 = pKVar1[uVar8 >> 1 & 0x3fffffff].field_2.iFunc;
        if ((int)uVar10 < 0) goto LAB_0055fc11;
        uVar7 = uVar7 & 1;
        iLit0 = uVar7 ^ uVar16;
        uVar8 = uVar8 & 1;
        iLit1 = uVar8 ^ uVar10;
        if (fHash == 0) {
          if (pMan->fGiaSimple == 0) {
            if (uVar16 < 2) {
              uVar3 = iLit1;
              if (uVar7 == uVar16) {
                uVar3 = 0;
              }
            }
            else {
              uVar3 = iLit0;
              if (uVar10 < 2) {
                if (uVar8 == uVar10) {
                  uVar3 = 0;
                }
              }
              else if ((iLit0 != iLit1) && (uVar3 = 0, (iLit1 ^ iLit0) != 1)) goto LAB_0055f812;
            }
          }
          else {
LAB_0055f812:
            uVar7 = pMan->nObjs;
            if (uVar7 == pMan->nObjsAlloc) {
              uVar8 = uVar7 * 2;
              if (0x1fffffff < (int)(uVar7 * 2)) {
                uVar8 = 0x20000000;
              }
              if (uVar7 == 0x20000000) {
                puts("Hard limit on the number of nodes (2^29) is reached. Quitting...");
                exit(1);
              }
              if ((int)uVar8 <= (int)uVar7) {
                __assert_fail("p->nObjs < nObjNew",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                              ,0x25f,"Gia_Obj_t *Gia_ManAppendObj(Gia_Man_t *)");
              }
              if (pMan->fVerbose != 0) {
                printf("Extending GIA object storage: %d -> %d.\n",(ulong)uVar7,(ulong)uVar8);
                uVar7 = pMan->nObjsAlloc;
              }
              if ((int)uVar7 < 1) {
                __assert_fail("p->nObjsAlloc > 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                              ,0x262,"Gia_Obj_t *Gia_ManAppendObj(Gia_Man_t *)");
              }
              lVar4 = (long)(int)uVar8;
              if (pMan->pObjs == (Gia_Obj_t *)0x0) {
                pGVar5 = (Gia_Obj_t *)malloc(lVar4 * 0xc);
              }
              else {
                pGVar5 = (Gia_Obj_t *)realloc(pMan->pObjs,lVar4 * 0xc);
                uVar7 = pMan->nObjsAlloc;
              }
              pMan->pObjs = pGVar5;
              memset(pGVar5 + (int)uVar7,0,(long)(int)(uVar8 - uVar7) * 0xc);
              if (pMan->pMuxes != (uint *)0x0) {
                puVar6 = (uint *)realloc(pMan->pMuxes,lVar4 * 4);
                pMan->pMuxes = puVar6;
                memset(puVar6 + pMan->nObjsAlloc,0,(lVar4 - pMan->nObjsAlloc) * 4);
              }
              pMan->nObjsAlloc = uVar8;
              uVar7 = pMan->nObjs;
            }
            uVar8 = uVar7 + 1;
            pMan->nObjs = uVar8;
            if ((int)uVar7 < 0) {
              __assert_fail("v >= 0 && v < p->nObjs",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                            ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
            }
            uVar16 = uVar16 >> 1;
            if (uVar8 <= uVar16) {
              __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                            ,0x27a,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
            }
            uVar10 = uVar10 >> 1;
            if (uVar8 <= uVar10) {
              __assert_fail("iLit1 >= 0 && Abc_Lit2Var(iLit1) < Gia_ManObjNum(p)",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                            ,0x27b,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
            }
            pGVar5 = pMan->pObjs + uVar7;
            if ((uVar16 == uVar10) && (pMan->fGiaSimple == 0)) {
              __assert_fail("p->fGiaSimple || Abc_Lit2Var(iLit0) != Abc_Lit2Var(iLit1)",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                            ,0x27c,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
            }
            uVar7 = uVar7 - uVar16 & 0x1fffffff;
            uVar15 = *(ulong *)pGVar5;
            if (iLit0 < iLit1) {
              uVar9 = (ulong)(uVar7 | (iLit0 & 1) << 0x1d);
              *(ulong *)pGVar5 = uVar9 | uVar15 & 0xffffffffc0000000;
              pGVar2 = pMan->pObjs;
              if ((pGVar5 < pGVar2) || (pGVar2 + pMan->nObjs <= pGVar5)) goto LAB_0055fc30;
              uVar15 = (ulong)(iLit1 & 1) << 0x3d |
                       (ulong)(((uint)((int)pGVar5 - (int)pGVar2) >> 2) * -0x55555555 - uVar10 &
                              0x1fffffff) << 0x20 | uVar9 | uVar15 & 0xc0000000c0000000;
            }
            else {
              uVar9 = (ulong)uVar7 << 0x20;
              uVar11 = (ulong)(iLit0 & 1) << 0x3d;
              *(ulong *)pGVar5 = uVar11 | uVar15 & 0xc0000000ffffffff | uVar9;
              pGVar2 = pMan->pObjs;
              if ((pGVar5 < pGVar2) || (pGVar2 + pMan->nObjs <= pGVar5)) goto LAB_0055fc30;
              uVar15 = (ulong)((iLit1 & 1) << 0x1d) | uVar11 | uVar15 & 0xc0000000c0000000 | uVar9 |
                       (ulong)(((uint)((int)pGVar5 - (int)pGVar2) >> 2) * -0x55555555 - uVar10 &
                              0x1fffffff);
            }
            *(ulong *)pGVar5 = uVar15;
            if (pMan->pFanData != (int *)0x0) {
              Gia_ObjAddFanout(pMan,pGVar5 + -(uVar15 & 0x1fffffff),pGVar5);
              Gia_ObjAddFanout(pMan,pGVar5 + -((ulong)*(uint *)&pGVar5->field_0x4 & 0x1fffffff),
                               pGVar5);
            }
            if (pMan->fSweeper != 0) {
              uVar9 = *(ulong *)pGVar5 & 0x1fffffff;
              uVar15 = *(ulong *)pGVar5 >> 0x20 & 0x1fffffff;
              uVar11 = 0x4000000000000000;
              if (((uint)*(ulong *)(pGVar5 + -uVar9) >> 0x1e & 1) == 0) {
                uVar11 = 0x40000000;
              }
              *(ulong *)(pGVar5 + -uVar9) = uVar11 | *(ulong *)(pGVar5 + -uVar9);
              uVar11 = *(ulong *)(pGVar5 + -uVar15);
              uVar12 = 0x4000000000000000;
              if (((uint)uVar11 >> 0x1e & 1) == 0) {
                uVar12 = 0x40000000;
              }
              *(ulong *)(pGVar5 + -uVar15) = uVar12 | uVar11;
              uVar15 = *(ulong *)pGVar5;
              *(ulong *)pGVar5 =
                   uVar15 & 0x7fffffffffffffff |
                   (ulong)(((uint)(uVar15 >> 0x3d) ^ (uint)(uVar11 >> 0x3f)) &
                          ((uint)((ulong)*(undefined8 *)(pGVar5 + -uVar9) >> 0x3f) ^
                          (uint)(uVar15 >> 0x1d) & 7)) << 0x3f;
            }
            pGVar2 = pMan->pObjs;
            if ((pGVar5 < pGVar2) || (pGVar2 + pMan->nObjs <= pGVar5)) {
LAB_0055fc30:
              __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                            ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
            }
            uVar3 = (int)((ulong)((long)pGVar5 - (long)pGVar2) >> 2) * 0x55555556;
          }
        }
        else {
          uVar3 = Gia_ManHashAnd(pMan,iLit0,iLit1);
        }
        *(uint *)(&(pKVar1->eEdge0).field_0x0 + lVar14) = uVar3;
        uVar13 = uVar13 + 1;
        lVar14 = lVar14 + 0x18;
      } while ((long)uVar13 < (long)pGraph->nSize);
      if ((int)uVar3 < 0) goto LAB_0055fc11;
      uVar7 = (uint)pGraph->eRoot & 1;
    }
    uVar7 = uVar7 ^ uVar3;
  }
  else {
    uVar7 = ~(uint)pGraph->eRoot & 1;
  }
  return uVar7;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Transforms the decomposition graph into the AIG.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Kit_GraphToGiaInternal( Gia_Man_t * pMan, Kit_Graph_t * pGraph, int fHash )
{
    Kit_Node_t * pNode = NULL;
    int i, pAnd0, pAnd1;
    // check for constant function
    if ( Kit_GraphIsConst(pGraph) )
        return Abc_LitNotCond( 1, Kit_GraphIsComplement(pGraph) );
    // check for a literal
    if ( Kit_GraphIsVar(pGraph) )
        return Abc_LitNotCond( Kit_GraphVar(pGraph)->iFunc, Kit_GraphIsComplement(pGraph) );
    // build the AIG nodes corresponding to the AND gates of the graph
    Kit_GraphForEachNode( pGraph, pNode, i )
    {
        pAnd0 = Abc_LitNotCond( Kit_GraphNode(pGraph, pNode->eEdge0.Node)->iFunc, pNode->eEdge0.fCompl ); 
        pAnd1 = Abc_LitNotCond( Kit_GraphNode(pGraph, pNode->eEdge1.Node)->iFunc, pNode->eEdge1.fCompl ); 
        if ( fHash )
            pNode->iFunc = Gia_ManHashAnd( pMan, pAnd0, pAnd1 );
        else
            pNode->iFunc = Gia_ManAppendAnd2( pMan, pAnd0, pAnd1 );
    }
    // complement the result if necessary
    return Abc_LitNotCond( pNode->iFunc, Kit_GraphIsComplement(pGraph) );
}